

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

void leveldb::PutVarint64(string *dst,uint64_t v)

{
  char buf [10];
  char local_1a [10];
  
  EncodeVarint64(local_1a,v);
  std::__cxx11::string::append((char *)dst,(ulong)local_1a);
  return;
}

Assistant:

void PutVarint64(std::string* dst, uint64_t v) {
  char buf[10];
  char* ptr = EncodeVarint64(buf, v);
  dst->append(buf, ptr - buf);
}